

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O0

void __thiscall
OpenMD::ForceMatrixDecomposition::ForceMatrixDecomposition
          (ForceMatrixDecomposition *this,SimInfo *info,InteractionManager *iMan)

{
  undefined8 *in_RDI;
  value_type *in_stack_fffffffffffffd88;
  vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_> *in_stack_fffffffffffffd90;
  vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_> *this_00;
  undefined8 in_stack_fffffffffffffd98;
  undefined8 *puVar1;
  Vector3<int> *in_stack_fffffffffffffda0;
  Vector3<int> *this_01;
  InteractionManager *in_stack_ffffffffffffff60;
  SimInfo *in_stack_ffffffffffffff68;
  ForceDecomposition *in_stack_ffffffffffffff70;
  
  ForceDecomposition::ForceDecomposition
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  *in_RDI = &PTR__ForceMatrixDecomposition_0050bbb8;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x36862a);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x368646);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x368662);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x36867e);
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::clear
            ((vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_> *)0x36869a);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (int)in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  this_01 = (Vector3<int> *)(in_RDI + 0x4e);
  Vector3<int>::Vector3
            (this_01,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),(int)in_stack_fffffffffffffd98,
             (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  puVar1 = in_RDI + 0x4e;
  Vector3<int>::Vector3
            (this_01,(int)((ulong)puVar1 >> 0x20),(int)puVar1,
             (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  this_00 = (vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_> *)(in_RDI + 0x4e);
  Vector3<int>::Vector3
            (this_01,(int)((ulong)puVar1 >> 0x20),(int)puVar1,(int)((ulong)this_00 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (this_00,in_stack_fffffffffffffd88);
  return;
}

Assistant:

ForceMatrixDecomposition::ForceMatrixDecomposition(SimInfo* info,
                                                     InteractionManager* iMan) :
      ForceDecomposition(info, iMan) {
    // Row and colum scans must visit all surrounding cells
    cellOffsets_.clear();
    cellOffsets_.push_back(Vector3i(-1, -1, -1));
    cellOffsets_.push_back(Vector3i(0, -1, -1));
    cellOffsets_.push_back(Vector3i(1, -1, -1));
    cellOffsets_.push_back(Vector3i(-1, 0, -1));
    cellOffsets_.push_back(Vector3i(0, 0, -1));
    cellOffsets_.push_back(Vector3i(1, 0, -1));
    cellOffsets_.push_back(Vector3i(-1, 1, -1));
    cellOffsets_.push_back(Vector3i(0, 1, -1));
    cellOffsets_.push_back(Vector3i(1, 1, -1));
    cellOffsets_.push_back(Vector3i(-1, -1, 0));
    cellOffsets_.push_back(Vector3i(0, -1, 0));
    cellOffsets_.push_back(Vector3i(1, -1, 0));
    cellOffsets_.push_back(Vector3i(-1, 0, 0));
    cellOffsets_.push_back(Vector3i(0, 0, 0));
    cellOffsets_.push_back(Vector3i(1, 0, 0));
    cellOffsets_.push_back(Vector3i(-1, 1, 0));
    cellOffsets_.push_back(Vector3i(0, 1, 0));
    cellOffsets_.push_back(Vector3i(1, 1, 0));
    cellOffsets_.push_back(Vector3i(-1, -1, 1));
    cellOffsets_.push_back(Vector3i(0, -1, 1));
    cellOffsets_.push_back(Vector3i(1, -1, 1));
    cellOffsets_.push_back(Vector3i(-1, 0, 1));
    cellOffsets_.push_back(Vector3i(0, 0, 1));
    cellOffsets_.push_back(Vector3i(1, 0, 1));
    cellOffsets_.push_back(Vector3i(-1, 1, 1));
    cellOffsets_.push_back(Vector3i(0, 1, 1));
    cellOffsets_.push_back(Vector3i(1, 1, 1));
  }